

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O3

bool __thiscall QXmlStreamReaderPrivate::scanAfterLangleBang(QXmlStreamReaderPrivate *this)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  short tokenToInject;
  char *str;
  
  lVar1 = (this->putStack).tos;
  if (lVar1 == -1) {
    if (this->readBufferPos < (this->readBuffer).d.size) {
      uVar3 = (uint)(ushort)(this->readBuffer).d.ptr[this->readBufferPos];
    }
    else {
      uVar3 = getChar_helper(this);
      if (uVar3 == 0xffffffff) {
        return false;
      }
      this->readBufferPos = this->readBufferPos + -1;
    }
  }
  else {
    uVar3 = (this->putStack).data[lVar1];
  }
  if ((int)uVar3 < 0x45) {
    if (uVar3 == 0x41) {
      str = "ATTLIST";
      tokenToInject = 0x1f;
    }
    else {
      if (uVar3 != 0x44) {
        return false;
      }
      str = "DOCTYPE";
      tokenToInject = 0x1d;
    }
  }
  else if (uVar3 == 0x45) {
    bVar2 = scanString(this,"ELEMENT",0x1e,true);
    if (bVar2) {
      return true;
    }
    str = "ENTITY";
    tokenToInject = 0x20;
  }
  else {
    if (uVar3 != 0x4e) {
      if (uVar3 != 0x5b) {
        return false;
      }
      str = "[CDATA[";
      tokenToInject = 0x1c;
      bVar2 = false;
      goto LAB_00391b02;
    }
    str = "NOTATION";
    tokenToInject = 0x21;
  }
  bVar2 = true;
LAB_00391b02:
  bVar2 = scanString(this,str,tokenToInject,bVar2);
  return bVar2;
}

Assistant:

bool QXmlStreamReaderPrivate::scanAfterLangleBang()
{
    switch (peekChar()) {
    case '[':
        return scanString(spell[CDATA_START], CDATA_START, false);
    case 'D':
        return scanString(spell[DOCTYPE], DOCTYPE);
    case 'A':
        return scanString(spell[ATTLIST], ATTLIST);
    case 'N':
        return scanString(spell[NOTATION], NOTATION);
    case 'E':
        if (scanString(spell[ELEMENT], ELEMENT))
            return true;
        return scanString(spell[ENTITY], ENTITY);

    default:
        ;
    };
    return false;
}